

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,float *points,ON_BoundingBox *tight_bbox,
               int bGrowBox,ON_Xform *xform)

{
  float fVar1;
  double dVar2;
  ON_Xform *pOVar3;
  ON_3dPoint *pOVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  float *pfVar8;
  double dVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  double *pdVar13;
  int i;
  ON_3fPoint Q;
  ON_BoundingBox bbox;
  ON_3dPoint P;
  bool local_cc;
  double local_c8;
  double local_c0;
  double local_b8;
  ON_Xform *local_b0;
  ON_3fPoint local_a4;
  ON_BoundingBox local_98;
  double local_68;
  ON_3dPoint local_60;
  double local_48;
  double local_40;
  ON_BoundingBox *local_38;
  
  ON_BoundingBox::ON_BoundingBox(&local_98);
  ON_3dPoint::ON_3dPoint(&local_60,0.0,0.0,0.0);
  ON_3fPoint::ON_3fPoint(&local_a4,0.0,0.0,0.0);
  if (bGrowBox == 0) {
    bVar10 = true;
  }
  else {
    bVar10 = ON_BoundingBox::IsNotEmpty(tight_bbox);
    bVar10 = !bVar10;
  }
  dVar7 = ON_BoundingBox::EmptyBoundingBox.m_max.z;
  dVar6 = ON_BoundingBox::EmptyBoundingBox.m_max.x;
  dVar5 = ON_BoundingBox::EmptyBoundingBox.m_min.z;
  dVar9 = ON_BoundingBox::EmptyBoundingBox.m_min.y;
  dVar2 = ON_BoundingBox::EmptyBoundingBox.m_min.x;
  if (bVar10) {
    (tight_bbox->m_max).y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
    (tight_bbox->m_max).z = dVar7;
    (tight_bbox->m_min).z = dVar5;
    (tight_bbox->m_max).x = dVar6;
    (tight_bbox->m_min).x = dVar2;
    (tight_bbox->m_min).y = dVar9;
  }
  if ((points == (float *)0x0 || (dim < 1 || count < 1)) ||
     ((count != 1 && (stride < (int)((uint)is_rat + dim))))) {
    local_cc = (bool)((bVar10 ^ 1U) & count == 0);
  }
  else {
    if (xform == (ON_Xform *)0x0) {
      local_b0 = (ON_Xform *)0x0;
    }
    else {
      bVar11 = ON_Xform::IsIdentity(xform,0.0);
      local_b0 = (ON_Xform *)0x0;
      if (!bVar11) {
        local_b0 = xform;
      }
    }
    i = 3;
    if (dim < 3) {
      i = dim;
    }
    local_cc = true;
    if (is_rat) {
      iVar12 = 1;
      if (count < 1) {
        iVar12 = count;
      }
      if ((points[(uint)dim] != 0.0) || (NAN(points[(uint)dim]))) {
        local_cc = true;
      }
      else {
        pfVar8 = points + stride;
        do {
          points = pfVar8;
          if (count < 2) {
            local_cc = false;
            count = iVar12 + -1;
            goto LAB_003e4be5;
          }
          count = count + -1;
        } while ((points[(uint)dim] == 0.0) && (pfVar8 = points + stride, !NAN(points[(uint)dim])));
        local_cc = false;
      }
LAB_003e4be5:
      if (count < 1) {
        return false;
      }
    }
    local_38 = tight_bbox;
    if (bVar10) {
      memcpy(&local_a4,points,(ulong)(uint)(i * 4));
      ON_3dPoint::operator=(&local_98.m_min,&local_a4);
      if (is_rat) {
        dVar2 = 1.0 / (double)points[(uint)dim];
        local_98.m_min.x = local_98.m_min.x * dVar2;
        local_98.m_min.y = local_98.m_min.y * dVar2;
        local_98.m_min.z = dVar2 * local_98.m_min.z;
      }
      if (local_b0 != (ON_Xform *)0x0) {
        ON_3dPoint::Transform(&local_98.m_min,local_b0);
      }
      local_98.m_max.z = local_98.m_min.z;
      local_98.m_max.x = local_98.m_min.x;
      local_98.m_max.y = local_98.m_min.y;
      points = points + stride;
      count = count + -1;
    }
    if (0 < count) {
      if (is_rat) {
        if (local_b0 == (ON_Xform *)0x0) {
          local_c0 = local_98.m_min.x;
          local_68 = local_98.m_min.y;
          local_40 = local_98.m_max.x;
          local_c8 = local_98.m_max.y;
          local_48 = local_98.m_min.z;
          local_b8 = local_98.m_max.z;
          do {
            fVar1 = points[(uint)dim];
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              dVar2 = 1.0 / (double)fVar1;
              memcpy(&local_a4,points,(ulong)(uint)(i << 2));
              local_60.x = (double)local_a4.x * dVar2;
              local_60.y = (double)local_a4.y * dVar2;
              local_60.z = (double)local_a4.z * dVar2;
              dVar2 = local_60.x;
              dVar9 = local_60.x;
              if ((local_c0 <= local_60.x) &&
                 (dVar2 = local_c0, dVar9 = local_98.m_min.x, local_40 < local_60.x)) {
                local_98.m_max.x = local_60.x;
                local_40 = local_60.x;
              }
              local_98.m_min.x = dVar9;
              local_c0 = dVar2;
              if (local_68 <= local_60.y) {
                pOVar4 = &local_98.m_max;
                dVar2 = local_60.y;
                if (local_c8 < local_60.y) goto LAB_003e50eb;
              }
              else {
                pOVar4 = &local_98.m_min;
                dVar2 = local_c8;
                local_68 = local_60.y;
LAB_003e50eb:
                pOVar4->y = local_60.y;
                local_c8 = dVar2;
              }
              if (local_48 <= local_60.z) {
                pOVar4 = &local_98.m_max;
                dVar2 = local_60.z;
                if (local_60.z <= local_b8) goto LAB_003e5135;
              }
              else {
                pOVar4 = &local_98.m_min;
                dVar2 = local_b8;
                local_48 = local_60.z;
              }
              pOVar4->z = local_60.z;
              local_b8 = dVar2;
            }
            else {
              local_cc = false;
            }
LAB_003e5135:
            count = count + -1;
            points = points + stride;
          } while (count != 0);
        }
        else {
          local_68 = (double)(ulong)(uint)(i * 4);
          do {
            fVar1 = points[(uint)dim];
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              dVar2 = 1.0 / (double)fVar1;
              memcpy(&local_a4,points,(size_t)local_68);
              local_60.x = (double)local_a4.x * dVar2;
              local_60.y = (double)local_a4.y * dVar2;
              local_60.z = (double)local_a4.z * dVar2;
              ON_3dPoint::Transform(&local_60,local_b0);
              if (local_98.m_min.x <= local_60.x) {
                if (local_98.m_max.x < local_60.x) {
                  local_98.m_max.x = local_60.x;
                }
              }
              else {
                local_98.m_min.x = local_60.x;
              }
              pOVar4 = &local_98.m_min;
              if ((local_60.y < local_98.m_min.y) ||
                 (pOVar4 = &local_98.m_max, local_98.m_max.y < local_60.y)) {
                pOVar4->y = local_60.y;
              }
              pOVar4 = &local_98.m_min;
              if ((local_60.z < local_98.m_min.z) ||
                 (pOVar4 = &local_98.m_max, local_98.m_max.z < local_60.z)) {
                pOVar4->z = local_60.z;
              }
            }
            else {
              local_cc = false;
            }
            count = count + -1;
            points = points + stride;
          } while (count != 0);
          if (dim < 3) {
            do {
              pdVar13 = ON_3dPoint::operator[](&local_98.m_min,i);
              *pdVar13 = 0.0;
              pdVar13 = ON_3dPoint::operator[](&local_98.m_max,i);
              *pdVar13 = 0.0;
              i = i + 1;
            } while (i != 3);
          }
        }
      }
      else if (local_b0 == (ON_Xform *)0x0) {
        local_b8 = local_98.m_min.x;
        local_c0 = local_98.m_min.y;
        local_68 = local_98.m_min.z;
        local_48 = local_98.m_max.x;
        local_b0 = (ON_Xform *)local_98.m_max.y;
        local_c8 = local_98.m_max.z;
        do {
          memcpy(&local_a4,points,(ulong)(uint)(i * 4));
          local_60.x = (double)local_a4.x;
          local_60.y = (double)local_a4.y;
          local_60.z = (double)local_a4.z;
          dVar2 = local_60.x;
          dVar9 = local_60.x;
          if ((local_b8 <= local_60.x) &&
             (dVar2 = local_b8, dVar9 = local_98.m_min.x, local_48 < local_60.x)) {
            local_98.m_max.x = local_60.x;
            local_48 = local_60.x;
          }
          local_98.m_min.x = dVar9;
          local_b8 = dVar2;
          if (local_c0 <= local_60.y) {
            pOVar4 = &local_98.m_max;
            pOVar3 = (ON_Xform *)local_60.y;
            if ((double)local_b0 < local_60.y) goto LAB_003e524d;
          }
          else {
            pOVar4 = &local_98.m_min;
            pOVar3 = local_b0;
            local_c0 = local_60.y;
LAB_003e524d:
            pOVar4->y = local_60.y;
            local_b0 = pOVar3;
          }
          if (local_68 <= local_60.z) {
            dVar2 = local_60.z;
            pOVar4 = &local_98.m_max;
            if (local_c8 < local_60.z) goto LAB_003e5284;
          }
          else {
            dVar2 = local_c8;
            local_68 = local_60.z;
            pOVar4 = &local_98.m_min;
LAB_003e5284:
            pOVar4->z = local_60.z;
            local_c8 = dVar2;
          }
          count = count + -1;
          points = points + stride;
        } while (count != 0);
      }
      else {
        do {
          memcpy(&local_a4,points,(ulong)(uint)(i * 4));
          local_60.x = (double)local_a4.x;
          local_60.y = (double)local_a4.y;
          local_60.z = (double)local_a4.z;
          ON_3dPoint::Transform(&local_60,local_b0);
          if (local_98.m_min.x <= local_60.x) {
            if (local_98.m_max.x < local_60.x) {
              local_98.m_max.x = local_60.x;
            }
          }
          else {
            local_98.m_min.x = local_60.x;
          }
          pOVar4 = &local_98.m_min;
          if ((local_60.y < local_98.m_min.y) ||
             (pOVar4 = &local_98.m_max, local_98.m_max.y < local_60.y)) {
            pOVar4->y = local_60.y;
          }
          pOVar4 = &local_98.m_min;
          if ((local_60.z < local_98.m_min.z) ||
             (pOVar4 = &local_98.m_max, local_98.m_max.z < local_60.z)) {
            pOVar4->z = local_60.z;
          }
          count = count + -1;
          points = points + stride;
        } while (count != 0);
        if (dim < 3) {
          do {
            pdVar13 = ON_3dPoint::operator[](&local_98.m_min,i);
            *pdVar13 = 0.0;
            pdVar13 = ON_3dPoint::operator[](&local_98.m_max,i);
            *pdVar13 = 0.0;
            i = i + 1;
          } while (i != 3);
        }
      }
    }
    ON_BoundingBox::Union(local_38,&local_98);
  }
  return local_cc;
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const float* points, 
    ON_BoundingBox& tight_bbox,
    int bGrowBox,
    const ON_Xform* xform
    )
{
  // bounding box workhorse
  ON_BoundingBox bbox;
  ON_3dPoint P(0.0,0.0,0.0);
  ON_3fPoint Q(0.0,0.0,0.0);
  double w;
  int i, wi;
  bool rc = false;
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }
  if ( is_rat )
  {
    is_rat = 1;
  }

  if ( count > 0 && dim > 0 && points && (count == 1 || stride >= dim+is_rat) ) 
  {
    if ( xform && xform->IsIdentity() )
    {
      xform = 0;
    }
    wi = dim;
    if ( dim > 3 )
    {
      dim = 3;
    }

    rc = true;
    if ( is_rat ) 
    {
      // skip bogus starting points
      while ( count > 0 && points[wi] == 0.0f ) 
      {
        count--;
        points += stride;
        rc = false;
      }
      if ( count <= 0 )
        return false;
    }

    if ( !bGrowBox  )
    {
      memcpy( &Q.x, points, dim*sizeof(Q.x) );
      bbox.m_min = Q;
      if ( is_rat )
      {
        w = 1.0/points[wi];
        bbox.m_min.x *= w; bbox.m_min.y *= w; bbox.m_min.z *= w;
      }
      if ( xform )
      {
        bbox.m_min.Transform(*xform);
      }
      bbox.m_max = bbox.m_min;
      points += stride;
      count--;
      bGrowBox = true;
    }

    if ( count > 0 ) 
    {
      if ( is_rat )
      {
        // homogeneous rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            w = 1.0/w;
            P.x = w*Q.x; P.y = w*Q.y; P.z = w*Q.z;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            w = 1.0/w;
            P.x = w*Q.x; P.y = w*Q.y; P.z = w*Q.z;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            P.x = Q.x; P.y = Q.y; P.z = Q.z;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            P.x = Q.x; P.y = Q.y; P.z = Q.z;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
    }

    tight_bbox.Union(bbox);
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = (0 == count);
  }

  return rc;
}